

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall cs_impl::fiber::Routine::Routine(Routine *this,context_t *cxt,function<void_()> *f)

{
  stack_type<cs::domain_type,_std::allocator> *this_00;
  function<void_()> *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  process_context *this_01;
  undefined8 *s;
  
  *in_RDI = cs::current_process;
  this_01 = (process_context *)(in_RDI + 1);
  cs::process_context::fork(this_01);
  s = in_RDI + 2;
  this_00 = (stack_type<cs::domain_type,_std::allocator> *)
            cs::process_context::child_stack_size((process_context *)cs::current_process);
  cs::stack_type<cs::domain_type,_std::allocator>::stack_type(this_00,(size_t)s);
  in_RDI[7] = in_RSI;
  std::function<void_()>::function((function<void_()> *)this_01,in_RDX);
  in_RDI[0xc] = 0;
  *(undefined1 *)(in_RDI + 0xd) = 0;
  return;
}

Assistant:

Routine(const cs::context_t &cxt, std::function<void()> f) : cs_pcontext(cs::current_process->fork()), cs_stack(cs::current_process->child_stack_size()), cs_context(cxt), func(std::move(f))
			{
				stack = nullptr;
				finished = false;
			}